

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  byte bVar1;
  stbi_uc sVar2;
  uchar uVar3;
  byte *pbVar4;
  bool bVar5;
  byte abVar6 [4];
  stbi_uc *psVar7;
  uint a;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  stbi_uc *psVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint y_00;
  int iVar22;
  uchar *puVar23;
  stbi_uc *psVar24;
  ulong uVar25;
  stbi_uc *unaff_R14;
  ulong __n;
  char cVar26;
  undefined4 uVar27;
  undefined8 unaff_R15;
  undefined7 uVar29;
  long lVar28;
  long *in_FS_OFFSET;
  bool bVar30;
  bool bVar31;
  uchar raw_data [4];
  uint local_94;
  byte local_8c [4];
  undefined8 local_88;
  undefined8 local_80;
  uint local_74;
  stbi_uc *local_70;
  undefined8 local_68;
  undefined4 local_5c;
  stbi_uc *local_58;
  stbi_uc *local_50;
  uint local_44;
  ulong local_40;
  uint local_34;
  
  uVar21 = (ulong)(uint)req_comp;
  psVar24 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  local_88 = x;
  if (psVar24 < psVar14) {
    s->img_buffer = psVar24 + 1;
    local_68 = (stbi_uc *)
               CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)psVar24 >> 8),*psVar24));
    psVar24 = psVar24 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
  }
  else {
    unaff_R14 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)unaff_R14,s->buflen);
    iVar11 = *(int *)&s->img_buffer - *(int *)&s->img_buffer_original;
    s->callback_already_read = s->callback_already_read + iVar11;
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
    }
    else {
      psVar14 = unaff_R14 + iVar10;
      local_68 = (stbi_uc *)CONCAT44(local_68._4_4_,CONCAT31((int3)((uint)iVar11 >> 8),*unaff_R14));
    }
    s->img_buffer_end = psVar14;
    psVar24 = s->buffer_start + 1;
    s->img_buffer = psVar24;
  }
  uVar29 = (undefined7)((ulong)unaff_R15 >> 8);
  if (psVar24 < psVar14) {
    s->img_buffer = psVar24 + 1;
    uVar27 = (undefined4)CONCAT71(uVar29,*psVar24);
    psVar24 = psVar24 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    uVar27 = 0;
  }
  else {
    unaff_R14 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)unaff_R14,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar27 = 0;
    }
    else {
      psVar14 = unaff_R14 + iVar10;
      uVar27 = (undefined4)CONCAT71(uVar29,*unaff_R14);
    }
    s->img_buffer_end = psVar14;
    psVar24 = s->buffer_start + 1;
    s->img_buffer = psVar24;
  }
  if (psVar24 < psVar14) {
    s->img_buffer = psVar24 + 1;
    bVar1 = *psVar24;
  }
  else if (s->read_from_callbacks == 0) {
    bVar1 = 0;
  }
  else {
    unaff_R14 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)unaff_R14,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar1 = 0;
    }
    else {
      psVar14 = unaff_R14 + iVar10;
      bVar1 = *unaff_R14;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar10 = stbi__get16le(s);
  local_70 = (stbi_uc *)CONCAT44(local_70._4_4_,iVar10);
  local_44 = stbi__get16le(s);
  psVar14 = s->img_buffer;
  if (psVar14 < s->img_buffer_end) {
    s->img_buffer = psVar14 + 1;
    uVar16 = CONCAT71((int7)((ulong)unaff_R14 >> 8),*psVar14);
  }
  else if (s->read_from_callbacks == 0) {
    uVar16 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar24 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar16 = 0;
    }
    else {
      psVar24 = psVar14 + iVar10;
      uVar16 = CONCAT71((int7)((ulong)psVar14 >> 8),*psVar14);
    }
    s->img_buffer_end = psVar24;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  iVar10 = stbi__get16le(s);
  iVar11 = stbi__get16le(s);
  local_80 = CONCAT44(extraout_var,iVar11);
  psVar24 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  if (psVar24 < psVar14) {
    s->img_buffer = psVar24 + 1;
    local_94 = (uint)CONCAT71((int7)((ulong)psVar24 >> 8),*psVar24);
    psVar24 = psVar24 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_94 = 0;
  }
  else {
    psVar24 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar24,s->buflen);
    iVar12 = *(int *)&s->img_buffer - *(int *)&s->img_buffer_original;
    s->callback_already_read = s->callback_already_read + iVar12;
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_94 = 0;
    }
    else {
      psVar14 = psVar24 + iVar11;
      local_94 = CONCAT31((int3)((uint)iVar12 >> 8),*psVar24);
    }
    s->img_buffer_end = psVar14;
    psVar24 = s->buffer_start + 1;
    s->img_buffer = psVar24;
    uVar16 = uVar16 & 0xffffffff;
  }
  if (psVar24 < psVar14) {
    s->img_buffer = psVar24 + 1;
    bVar18 = *psVar24;
  }
  else if (s->read_from_callbacks == 0) {
    bVar18 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      psVar24 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar18 = 0;
    }
    else {
      psVar24 = psVar14 + iVar11;
      bVar18 = *psVar14;
    }
    uVar16 = uVar16 & 0xffffffff;
    s->img_buffer_end = psVar24;
    s->img_buffer = s->buffer_start + 1;
  }
  local_8c[0] = 0;
  local_8c[1] = 0;
  local_8c[2] = 0;
  local_8c[3] = 0;
  cVar26 = (char)uVar27;
  uVar29 = (undefined7)(uVar16 >> 8);
  if (cVar26 == '\0') {
    uVar19 = local_94 & 0xff;
    if ((local_94 & 0xff) < 0x10) {
      if ((local_94 & 0xff) == 8) {
LAB_0044119d:
        bVar31 = true;
        bVar5 = false;
        uVar19 = (uint)CONCAT71(uVar29,1);
        goto LAB_004411ed;
      }
      if (uVar19 == 0xf) goto LAB_00441183;
    }
    else {
      if ((uVar19 == 0x20) || (uVar19 == 0x18)) {
        uVar16 = (ulong)local_94;
        goto LAB_004411db;
      }
      if (uVar19 == 0x10) {
        uVar19 = bVar1 - 8;
        if (bVar1 < 8) {
          uVar19 = (uint)bVar1;
        }
        if (uVar19 != 3) goto LAB_00441183;
        uVar19 = (uint)CONCAT71(uVar29,2);
        goto LAB_004411df;
      }
    }
LAB_004411b7:
    lVar28 = *in_FS_OFFSET;
    pcVar15 = "bad format";
    goto LAB_004413c8;
  }
  uVar19 = (uint)uVar16 & 0xff;
  if (uVar19 < 0x18) {
    if (1 < uVar19 - 0xf) {
      if (uVar19 == 8) goto LAB_0044119d;
      goto LAB_004411b7;
    }
LAB_00441183:
    uVar19 = (uint)CONCAT71(uVar29,3);
    bVar5 = true;
    bVar31 = false;
  }
  else {
    if ((uVar19 != 0x18) && (uVar19 != 0x20)) goto LAB_004411b7;
LAB_004411db:
    uVar19 = (uint)CONCAT71((int7)(uVar16 >> 8),(byte)uVar16 >> 3);
LAB_004411df:
    bVar31 = true;
    bVar5 = false;
  }
LAB_004411ed:
  uVar20 = uVar19 & 0xff;
  *local_88 = iVar10;
  iVar11 = (int)local_80;
  *y = iVar11;
  if (comp != (int *)0x0) {
    *comp = uVar20;
  }
  iVar12 = stbi__mad3sizes_valid(iVar10,iVar11,uVar20,0);
  if (iVar12 == 0) {
    lVar28 = *in_FS_OFFSET;
    pcVar15 = "too large";
    goto LAB_004413c8;
  }
  local_58 = (stbi_uc *)stbi__malloc_mad3(iVar10,iVar11,uVar20,0);
  if (local_58 == (stbi_uc *)0x0) {
LAB_004413b5:
    lVar28 = *in_FS_OFFSET;
    pcVar15 = "outofmem";
    goto LAB_004413c8;
  }
  local_34 = uVar19;
  stbi__skip(s,(uint)(byte)local_68);
  a = local_44;
  psVar14 = local_58;
  y_00 = (uint)uVar21;
  local_88 = (int *)(CONCAT44(local_88._4_4_,uVar19) & 0xffffffff000000ff);
  if ((bVar1 < 8 && cVar26 == '\0') && !bVar5) {
    if ((int)local_80 != 0) {
      iVar12 = iVar10 * (int)local_88;
      iVar22 = 0;
      iVar11 = (int)local_80;
      do {
        iVar11 = iVar11 + -1;
        iVar13 = iVar22;
        if ((bVar18 >> 5 & 1) == 0) {
          iVar13 = iVar11;
        }
        stbi__getn(s,psVar14 + iVar13 * iVar12,iVar12);
        y_00 = (uint)uVar21;
        iVar22 = iVar22 + 1;
      } while (iVar11 != 0);
    }
    goto LAB_0044185b;
  }
  local_5c = uVar27;
  if (cVar26 == '\0') {
    local_50 = (stbi_uc *)0x0;
  }
  else {
    if (local_44 == 0) {
LAB_00441391:
      free(psVar14);
      lVar28 = *in_FS_OFFSET;
      pcVar15 = "bad palette";
LAB_004413c8:
      *(char **)(lVar28 + -8) = pcVar15;
      return (void *)0x0;
    }
    stbi__skip(s,(int)local_70);
    psVar14 = (stbi_uc *)stbi__malloc_mad2(a,uVar20,0);
    local_50 = psVar14;
    if (psVar14 == (stbi_uc *)0x0) {
      free(local_58);
      goto LAB_004413b5;
    }
    if (bVar31) {
      iVar11 = stbi__getn(s,psVar14,a * uVar20);
      if (iVar11 == 0) {
        free(local_58);
        goto LAB_00441391;
      }
    }
    else {
      if (uVar20 != 3) {
        __assert_fail("tga_comp == STBI_rgb",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                      ,0x1746,
                      "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                     );
      }
      lVar28 = 0;
      do {
        uVar19 = stbi__get16le(s);
        psVar14[lVar28] = (stbi_uc)(((uVar19 >> 10 & 0x1f) * 0xff) / 0x1f);
        psVar14[lVar28 + 1] = (stbi_uc)(((uVar19 >> 5 & 0x1f) * 0xff) / 0x1f);
        psVar14[lVar28 + 2] = (stbi_uc)(((uVar19 & 0x1f) * 0xff) / 0x1f);
        lVar28 = lVar28 + 3;
      } while (a * 3 != (int)lVar28);
    }
  }
  y_00 = (uint)uVar21;
  if ((int)local_80 * iVar10 != 0) {
    local_68 = s->buffer_start;
    local_70 = s->buffer_start + 1;
    __n = (ulong)local_88 & 0xffffffff;
    uVar16 = (ulong)(uint)((int)local_80 * iVar10);
    bVar8 = true;
    uVar25 = 0;
    local_74 = 0;
    iVar11 = 0;
    local_40 = uVar16;
    do {
      psVar14 = local_68;
      if (bVar1 < 8) {
LAB_0044158e:
        psVar14 = local_68;
        if ((char)local_5c == '\0') {
          if (!bVar31) {
            if ((int)local_88 != 3) {
              __assert_fail("tga_comp == STBI_rgb",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                            ,0x1777,
                            "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                           );
            }
            uVar19 = stbi__get16le(s);
            abVar6 = local_8c;
            local_8c[1] = (char)(((uVar19 >> 5 & 0x1f) * 0xff) / 0x1f);
            local_8c[0] = (char)(((uVar19 >> 10 & 0x1f) * 0xff) / 0x1f);
            local_8c[3] = abVar6[3];
            local_8c[2] = (char)(((uVar19 & 0x1f) * 0xff) / 0x1f);
            goto LAB_004417a8;
          }
          if ((int)local_88 != 0) {
            psVar14 = s->img_buffer;
            psVar24 = s->img_buffer_end;
            uVar17 = 0;
            do {
              psVar7 = local_68;
              if (psVar14 < psVar24) {
                s->img_buffer = psVar14 + 1;
                bVar9 = *psVar14;
                psVar14 = psVar14 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar9 = 0;
              }
              else {
                iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
                s->callback_already_read =
                     s->callback_already_read +
                     (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                if (iVar12 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar9 = 0;
                  psVar24 = local_70;
                }
                else {
                  bVar9 = *psVar7;
                  psVar24 = psVar7 + iVar12;
                }
                s->img_buffer_end = psVar24;
                s->img_buffer = local_70;
                psVar14 = local_70;
              }
              local_8c[uVar17] = bVar9;
              uVar17 = uVar17 + 1;
              uVar16 = local_40;
            } while (__n != uVar17);
            goto LAB_00441681;
          }
        }
        else {
          if ((char)local_94 == '\b') {
            pbVar4 = s->img_buffer;
            if (pbVar4 < s->img_buffer_end) {
              s->img_buffer = pbVar4 + 1;
              bVar9 = *pbVar4;
            }
            else if (s->read_from_callbacks == 0) {
              bVar9 = 0;
            }
            else {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
              s->callback_already_read =
                   s->callback_already_read +
                   (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar9 = 0;
                psVar14 = local_70;
              }
              else {
                bVar9 = *psVar14;
                psVar14 = psVar14 + iVar12;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = local_70;
              uVar16 = local_40;
            }
            uVar19 = (uint)bVar9;
          }
          else {
            uVar19 = stbi__get16le(s);
          }
          if ((int)local_88 != 0) {
            if (local_44 <= uVar19) {
              uVar19 = 0;
            }
            memcpy(local_8c,local_50 + uVar19 * (int)local_88,__n);
LAB_004417a8:
            memcpy(local_58 + (uint)((int)local_88 * (int)uVar25),local_8c,__n);
          }
        }
      }
      else {
        if (iVar11 == 0) {
          pbVar4 = s->img_buffer;
          if (pbVar4 < s->img_buffer_end) {
            s->img_buffer = pbVar4 + 1;
            bVar9 = *pbVar4;
          }
          else if (s->read_from_callbacks == 0) {
            bVar9 = 0;
          }
          else {
            iVar11 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
            s->callback_already_read =
                 s->callback_already_read +
                 (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
            if (iVar11 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar9 = 0;
              psVar14 = local_70;
            }
            else {
              bVar9 = *psVar14;
              psVar14 = psVar14 + iVar11;
            }
            s->img_buffer_end = psVar14;
            s->img_buffer = local_70;
          }
          iVar11 = (bVar9 & 0x7f) + 1;
          local_74 = (uint)(bVar9 >> 7);
          goto LAB_0044158e;
        }
        bVar30 = local_74 != 0;
        local_74 = 1;
        if (!bVar30 || bVar8) {
          local_74 = (uint)bVar30;
          goto LAB_0044158e;
        }
LAB_00441681:
        if ((int)local_88 != 0) goto LAB_004417a8;
      }
      y_00 = (uint)uVar21;
      iVar11 = iVar11 + -1;
      uVar25 = uVar25 + 1;
      bVar8 = false;
    } while (uVar25 != uVar16);
  }
  psVar14 = local_58;
  if ((bVar18 >> 5 & 1) == 0 && (int)local_80 != 0) {
    iVar11 = iVar10 * (int)local_88;
    iVar12 = iVar11 * ((int)local_80 - 1U);
    uVar20 = 0;
    uVar19 = 0;
    do {
      if (iVar11 != 0) {
        psVar24 = local_58;
        iVar22 = iVar11 + 1;
        do {
          sVar2 = psVar24[uVar20];
          psVar24[uVar20] = psVar24[iVar12];
          psVar24[iVar12] = sVar2;
          psVar24 = psVar24 + 1;
          iVar22 = iVar22 + -1;
        } while (1 < iVar22);
      }
      y_00 = uVar19 + 1;
      iVar12 = iVar12 - iVar11;
      uVar20 = uVar20 + iVar11;
      bVar31 = uVar19 != (int)local_80 - 1U >> 1;
      uVar19 = y_00;
    } while (bVar31);
  }
  if (local_50 != (stbi_uc *)0x0) {
    free(local_50);
  }
LAB_0044185b:
  if ((!bVar5 && 2 < (byte)local_34) && (y_00 = (uint)local_80 * iVar10, y_00 != 0)) {
    puVar23 = psVar14 + 2;
    do {
      uVar3 = puVar23[-2];
      puVar23[-2] = *puVar23;
      *puVar23 = uVar3;
      puVar23 = puVar23 + ((ulong)local_88 & 0xffffffff);
      y_00 = y_00 - 1;
    } while (y_00 != 0);
  }
  if ((int)local_88 == 4) {
    return psVar14;
  }
  puVar23 = stbi__convert_format(psVar14,(int)local_88,iVar10,(uint)local_80,y_00);
  return puVar23;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}